

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O2

void nghttp2_stream_reschedule(nghttp2_stream *stream)

{
  nghttp2_stream *pnVar1;
  uint64_t uVar2;
  
  if (stream->queued == '\0') {
    __assert_fail("stream->queued",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                  ,0xe5,"void nghttp2_stream_reschedule(nghttp2_stream *)");
  }
  while (pnVar1 = stream->dep_prev, pnVar1 != (nghttp2_stream *)0x0) {
    nghttp2_pq_remove(&pnVar1->obq,&stream->pq_entry);
    stream_next_cycle(stream,pnVar1->descendant_last_cycle);
    uVar2 = pnVar1->descendant_next_seq;
    pnVar1->descendant_next_seq = uVar2 + 1;
    stream->seq = uVar2;
    nghttp2_pq_push(&pnVar1->obq,&stream->pq_entry);
    pnVar1->last_writelen = stream->last_writelen;
    stream = pnVar1;
  }
  return;
}

Assistant:

void nghttp2_stream_reschedule(nghttp2_stream *stream) {
  nghttp2_stream *dep_stream;

  assert(stream->queued);

  dep_stream = stream->dep_prev;

  for (; dep_stream; stream = dep_stream, dep_stream = dep_stream->dep_prev) {
    nghttp2_pq_remove(&dep_stream->obq, &stream->pq_entry);

    stream_next_cycle(stream, dep_stream->descendant_last_cycle);
    stream->seq = dep_stream->descendant_next_seq++;

    nghttp2_pq_push(&dep_stream->obq, &stream->pq_entry);

    DEBUGF("stream: stream=%d obq resched cycle=%lu\n", stream->stream_id,
           stream->cycle);

    dep_stream->last_writelen = stream->last_writelen;
  }
}